

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  secp256k1_ge *in_RDI;
  int ret;
  secp256k1_fe *in_stack_00000038;
  secp256k1_ge *in_stack_00000040;
  
  iVar1 = secp256k1_ge_set_xquad(in_stack_00000040,in_stack_00000038);
  secp256k1_fe_impl_normalize_var(&in_RDI->y);
  iVar2 = secp256k1_fe_impl_is_odd(&in_RDI->y);
  if (iVar2 != in_EDX) {
    secp256k1_fe_impl_negate_unchecked(&in_RDI->y,&in_RDI->y,1);
  }
  secp256k1_ge_verify(in_RDI);
  return iVar1;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    int ret;
    ret = secp256k1_ge_set_xquad(r, x);
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }
    secp256k1_ge_verify(r);
    return ret;
}